

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O0

void nn_bws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_list *self_00;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_aws *aws;
  nn_bws *bws;
  nn_list_item *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  nn_list_item *in_stack_ffffffffffffffa8;
  long local_30;
  
  local_30 = in_RDI;
  if (in_RDI == 0) {
    local_30 = 0;
  }
  if (*(int *)(local_30 + 0x58) == 1) {
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","src == NN_FSM_ACTION",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
              ,0xff);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","type == NN_FSM_START",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
              ,0x100);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)(local_30 + 0x58) = 2;
  }
  else {
    if (*(int *)(local_30 + 0x58) != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_30 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
              ,0x12f);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI == 1) {
      if (in_EDX != 8 && in_EDX != 7) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
                ,0x10a);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (in_ESI != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","src == NN_BWS_SRC_AWS",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
                ,0x110);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX == 0x85b7) {
        self_00 = (nn_list *)(local_30 + 0x2d0);
        nn_list_end((nn_list *)(local_30 + 0x2d0));
        nn_list_insert(self_00,in_stack_ffffffffffffffa8,
                       (nn_list_item *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                      );
        *(undefined8 *)(local_30 + 0x2c8) = 0;
        nn_bws_start_accepting((nn_bws *)0x1eefc0);
      }
      else if (in_EDX == 0x85b8) {
        nn_aws_stop((nn_aws *)0x1eefcf);
      }
      else {
        if (in_EDX != 0x85b9) {
          nn_backtrace_print();
          fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                  (ulong)*(uint *)(local_30 + 0x58),2,(ulong)in_EDX,
                  "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
                  ,0x128);
          fflush(_stderr);
          nn_err_abort();
        }
        nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
        nn_aws_term((nn_aws *)0x1eeffb);
        nn_free((void *)0x1ef005);
      }
    }
  }
  return;
}

Assistant:

static void nn_bws_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bws *bws;
    struct nn_aws *aws;

    bws = nn_cont (self, struct nn_bws, fsm);

    switch (bws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BWS_STATE_IDLE:
        nn_assert (src == NN_FSM_ACTION);
        nn_assert (type == NN_FSM_START);
        bws->state = NN_BWS_STATE_ACTIVE;
        return;

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the aws state machine in this state.          */
/******************************************************************************/
    case NN_BWS_STATE_ACTIVE:
        if (src == NN_BWS_SRC_USOCK) {
            nn_assert (type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED);
            return;
        }

        /*  For all remaining events we'll assume they are coming from one
            of remaining child aws objects. */
        nn_assert (src == NN_BWS_SRC_AWS);
        aws = (struct nn_aws*) srcptr;
        switch (type) {
        case NN_AWS_ACCEPTED:

            /*  Move the newly created connection to the list of existing
                connections. */
            nn_list_insert (&bws->awss, &bws->aws->item,
                nn_list_end (&bws->awss));
            bws->aws = NULL;

            /*  Start waiting for a new incoming connection. */
            nn_bws_start_accepting (bws);
            return;

        case NN_AWS_ERROR:
            nn_aws_stop (aws);
            return;
        case NN_AWS_STOPPED:
            nn_list_erase (&bws->awss, &aws->item);
            nn_aws_term (aws);
            nn_free (aws);
            return;
        default:
            nn_fsm_bad_action (bws->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (bws->state, src, type);
    }
}